

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

int __thiscall
TFileNameDatabase::CreateDatabase(TFileNameDatabase *this,LPBYTE pbMarData,size_t cbMarData)

{
  int iVar1;
  TByteStream local_30;
  
  local_30.field_C = 0;
  local_30.pvMappedFile = (void *)0x0;
  local_30.hFile = (HANDLE)0x0;
  local_30.hMap = (HANDLE)0x0;
  iVar1 = 0x16;
  if (((pbMarData != (LPBYTE)0x0 || cbMarData == 0) && (pbMarData != (LPBYTE)0x0 || cbMarData == 0))
     && (iVar1 = 1000, 3 < cbMarData)) {
    local_30.pbByteData = pbMarData + 4;
    local_30.cbByteData = cbMarData - 4;
    if (*(int *)pbMarData == 0x52414d) {
      iVar1 = LoadFromStream(this,&local_30);
    }
  }
  return iVar1;
}

Assistant:

int CreateDatabase(LPBYTE pbMarData, size_t cbMarData)
    {
        TByteStream ByteStream;
        DWORD dwSignature;
        int nError;

        if(pbMarData == NULL && cbMarData != 0)
            return ERROR_INVALID_PARAMETER;

        nError = ByteStream.SetByteBuffer(pbMarData, cbMarData);
        if(nError == ERROR_SUCCESS)
        {
            // Get pointer to MAR signature
            nError = ByteStream.GetValue<DWORD>(dwSignature);
            if(nError != ERROR_SUCCESS)
                return nError;

            // Verify the signature
            if(dwSignature != MNDX_MAR_SIGNATURE)
                return ERROR_BAD_FORMAT;

            // HOTS: 1956E11
            nError = LoadFromStream(ByteStream);
        }

        return nError;
    }